

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MappedPointerVector.hpp
# Opt level: O1

void __thiscall
gmlc::containers::MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle>::clear
          (MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle> *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer this_00;
  
  puVar1 = (this->dataStorage).
           super__Vector_base<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->dataStorage).
           super__Vector_base<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = puVar1;
  if (puVar2 != puVar1) {
    do {
      std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>::~unique_ptr
                (this_00);
      this_00 = this_00 + 1;
    } while (this_00 != puVar2);
    (this->dataStorage).
    super__Vector_base<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  std::
  _Hashtable<helics::GlobalHandle,_std::pair<const_helics::GlobalHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalHandle>,_std::hash<helics::GlobalHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->lookup)._M_h);
  return;
}

Assistant:

void clear()
    {
        dataStorage.clear();
        lookup.clear();
    }